

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sim.cc
# Opt level: O0

void __thiscall sim_value_array_Test::TestBody(sim_value_array_Test *this)

{
  undefined1 *this_00;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<unsigned_int> __l_02;
  __node_base var;
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  Generator *this_01;
  Var *pVVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar5;
  unsigned_long *puVar6;
  undefined4 extraout_var_01;
  char *in_R9;
  optional<unsigned_long> oVar7;
  AssertHelper local_630;
  Message local_628;
  int local_61c;
  undefined1 local_618 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_5e8;
  Message local_5e0;
  bool local_5d1;
  undefined1 local_5d0 [8];
  AssertionResult gtest_ar__1;
  undefined4 uStack_5b8;
  AssertHelper local_5b0;
  Message local_5a8;
  undefined1 local_5a0 [8];
  AssertionResult gtest_ar;
  AssertHelper local_570;
  Message local_568;
  bool local_559;
  undefined1 local_558 [8];
  AssertionResult gtest_ar_;
  optional<unsigned_long> res;
  unsigned_long local_530;
  iterator local_528;
  size_type local_520;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_518;
  optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> local_500;
  uint local_4dc;
  undefined1 local_4d8 [4];
  uint32_t value;
  Simulator sim;
  shared_ptr<kratos::Stmt> local_320;
  undefined1 local_310 [32];
  undefined1 local_2f0 [39];
  allocator<char> local_2c9;
  string local_2c8;
  Var *local_2a8;
  Var *c;
  pointer local_298;
  pointer local_290;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_288;
  allocator<char> local_269;
  string local_268;
  __node_base local_248;
  Var *d;
  float local_238 [2];
  float *local_230;
  __node_base local_228;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_220;
  allocator<char> local_201;
  string local_200;
  Var *local_1e0;
  Var *b;
  __node_base local_1d0;
  __node_base *local_1c8;
  __buckets_ptr local_1c0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1b8;
  allocator<char> local_199;
  string local_198;
  Var *local_178;
  Var *a;
  allocator<char> local_159;
  string local_158;
  undefined8 local_138;
  Generator *mod;
  Context context;
  sim_value_array_Test *this_local;
  
  context.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)this;
  kratos::Context::Context((Context *)&mod);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"mod",&local_159);
  this_01 = kratos::Context::generator((Context *)&mod,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  local_138 = this_01;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"a",&local_199);
  local_1d0._M_nxt._0_4_ = 2;
  local_1d0._M_nxt._4_4_ = 2;
  local_1c8 = &local_1d0;
  local_1c0 = (__buckets_ptr)0x2;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&b + 7));
  __l_02._M_len = (size_type)local_1c0;
  __l_02._M_array = (iterator)local_1c8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_1b8,__l_02,(allocator<unsigned_int> *)((long)&b + 7));
  pVVar4 = kratos::Generator::var(this_01,&local_198,4,&local_1b8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_1b8);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&b + 7));
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  uVar1 = local_138;
  local_178 = pVVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"b",&local_201);
  local_238[0] = 2.8026e-45;
  local_238[1] = 2.8026e-45;
  local_230 = local_238;
  local_228._M_nxt = (_Hash_node_base *)0x2;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&d + 7));
  __l_01._M_len = (size_type)local_228._M_nxt;
  __l_01._M_array = (iterator)local_230;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_220,__l_01,(allocator<unsigned_int> *)((long)&d + 7));
  pVVar4 = kratos::Generator::var((Generator *)uVar1,&local_200,4,&local_220);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_220);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&d + 7));
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator(&local_201);
  uVar1 = local_138;
  local_1e0 = pVVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"d",&local_269);
  c._4_4_ = 2;
  local_298 = (pointer)((long)&c + 4);
  local_290 = (pointer)0x1;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&c + 3));
  __l_00._M_len = (size_type)local_290;
  __l_00._M_array = (iterator)local_298;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_288,__l_00,(allocator<unsigned_int> *)((long)&c + 3));
  pVVar4 = kratos::Generator::var((Generator *)uVar1,&local_268,2,&local_288);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_288);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&c + 3));
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator(&local_269);
  local_248._M_nxt = (_Hash_node_base *)pVVar4;
  (*(pVVar4->super_IRNode)._vptr_IRNode[0x19])(pVVar4,1);
  uVar1 = local_138;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,"c",&local_2c9);
  pVVar4 = kratos::Generator::var((Generator *)uVar1,&local_2c8,4);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::~allocator(&local_2c9);
  uVar1 = local_138;
  local_2a8 = pVVar4;
  kratos::Var::assign((Var *)local_2f0,local_178);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            ((shared_ptr<kratos::Stmt> *)(local_2f0 + 0x10),
             (shared_ptr<kratos::AssignStmt> *)local_2f0);
  kratos::Generator::add_stmt((Generator *)uVar1,(shared_ptr<kratos::Stmt> *)(local_2f0 + 0x10));
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_2f0 + 0x10));
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_2f0);
  uVar1 = local_138;
  pVVar4 = local_2a8;
  iVar3 = (*(local_178->super_IRNode)._vptr_IRNode[9])(local_178,1);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x48))
            ((long *)CONCAT44(extraout_var,iVar3),1);
  kratos::Var::assign((Var *)local_310,pVVar4);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            ((shared_ptr<kratos::Stmt> *)(local_310 + 0x10),
             (shared_ptr<kratos::AssignStmt> *)local_310);
  kratos::Generator::add_stmt((Generator *)uVar1,(shared_ptr<kratos::Stmt> *)(local_310 + 0x10));
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_310 + 0x10));
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_310);
  uVar1 = local_138;
  var._M_nxt = local_248._M_nxt;
  kratos::constant(4,4,false);
  kratos::Var::assign((Var *)&sim.simulation_depth_,(Var *)var._M_nxt);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            (&local_320,(shared_ptr<kratos::AssignStmt> *)&sim.simulation_depth_);
  kratos::Generator::add_stmt((Generator *)uVar1,&local_320);
  std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_320);
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr
            ((shared_ptr<kratos::AssignStmt> *)&sim.simulation_depth_);
  kratos::Simulator::Simulator((Simulator *)local_4d8,(Generator *)local_138);
  local_4dc = 5;
  iVar3 = (*(local_1e0->super_IRNode)._vptr_IRNode[9])(local_1e0,1);
  pVVar4 = (Var *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x48))
                            ((long *)CONCAT44(extraout_var_00,iVar3),1);
  local_530 = 5;
  local_528 = &local_530;
  local_520 = 1;
  this_00 = &res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>.field_0xf;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)this_00);
  __l._M_len = local_520;
  __l._M_array = local_528;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_518,__l,(allocator_type *)this_00);
  std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
  optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true>(&local_500,&local_518);
  kratos::Simulator::set((Simulator *)local_4d8,pVVar4,&local_500,true);
  std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~optional(&local_500);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_518);
  std::allocator<unsigned_long>::~allocator
            ((allocator<unsigned_long> *)
             &res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>.field_0xf);
  oVar7 = kratos::Simulator::get((Simulator *)local_4d8,local_2a8);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ =
       oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_engaged;
  local_559 = std::operator!=(&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_558,&local_559,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_558);
  if (!bVar2) {
    testing::Message::Message(&local_568);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_558,
               (AssertionResult *)"res != std::nullopt","false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_570,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_sim.cc",
               0x48,pcVar5);
    testing::internal::AssertHelper::operator=(&local_570,&local_568);
    testing::internal::AssertHelper::~AssertHelper(&local_570);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_568);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_558);
  puVar6 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)&gtest_ar_.message_);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_5a0,"*res","value",puVar6,&local_4dc);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5a0);
  if (!bVar2) {
    testing::Message::Message(&local_5a8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_5a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_5b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_sim.cc",
               0x49,pcVar5);
    testing::internal::AssertHelper::operator=(&local_5b0,&local_5a8);
    testing::internal::AssertHelper::~AssertHelper(&local_5b0);
    testing::Message::~Message(&local_5a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5a0);
  iVar3 = (*((IRNode *)&(local_248._M_nxt)->_M_nxt)->_vptr_IRNode[9])(local_248._M_nxt,1);
  oVar7 = kratos::Simulator::get((Simulator *)local_4d8,(Var *)CONCAT44(extraout_var_01,iVar3));
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  uStack_5b8 = CONCAT31(uStack_5b8._1_3_,
                        oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                        super__Optional_payload_base<unsigned_long>._M_engaged);
  res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_4_ = uStack_5b8;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       gtest_ar__1.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  local_5d1 = std::operator!=(&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5d0,&local_5d1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5d0);
  if (!bVar2) {
    testing::Message::Message(&local_5e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_5d0,
               (AssertionResult *)"res != std::nullopt","false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_5e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_sim.cc",
               0x4c,pcVar5);
    testing::internal::AssertHelper::operator=(&local_5e8,&local_5e0);
    testing::internal::AssertHelper::~AssertHelper(&local_5e8);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_5e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5d0);
  puVar6 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)&gtest_ar_.message_);
  local_61c = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_618,"*res","4 >> 2",puVar6,&local_61c);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_618);
  if (!bVar2) {
    testing::Message::Message(&local_628);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_618);
    testing::internal::AssertHelper::AssertHelper
              (&local_630,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_sim.cc",
               0x4d,pcVar5);
    testing::internal::AssertHelper::operator=(&local_630,&local_628);
    testing::internal::AssertHelper::~AssertHelper(&local_630);
    testing::Message::~Message(&local_628);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_618);
  kratos::Simulator::~Simulator((Simulator *)local_4d8);
  kratos::Context::~Context((Context *)&mod);
  return;
}

Assistant:

TEST(sim, value_array) {  // NOLINT
    Context context;
    auto &mod = context.generator("mod");
    auto &a = mod.var("a", 4, {2, 2});
    auto &b = mod.var("b", 4, {2, 2});
    auto &d = mod.var("d", 2, std::vector<uint32_t>{2});
    d.set_is_packed(true);
    auto &c = mod.var("c", 4);
    mod.add_stmt(a.assign(b));
    mod.add_stmt(c.assign(a[1][1]));
    mod.add_stmt(d.assign(constant(4, 4)));

    Simulator sim(&mod);
    uint32_t constexpr value = 5;
    sim.set(&(b[1][1]), std::vector<uint64_t>{value});

    auto res = sim.get(&c);
    EXPECT_TRUE(res != std::nullopt);
    EXPECT_EQ(*res, value);

    res = sim.get(&d[1]);
    EXPECT_TRUE(res != std::nullopt);
    EXPECT_EQ(*res, 4 >> 2);
}